

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunction_Fillet3.cpp
# Opt level: O2

void __thiscall
chrono::ChFunction_Fillet3::ArchiveIN(ChFunction_Fillet3 *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_90;
  ChNameValue<double> local_78;
  ChNameValue<double> local_60;
  ChNameValue<double> local_48;
  ChNameValue<double> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChFunction_Fillet3>(marchive);
  ChFunction::ArchiveIN(&this->super_ChFunction,marchive);
  local_30._value = &this->end;
  local_30._name = "end";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->y1;
  local_48._name = "y1";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  local_60._value = &this->y2;
  local_60._name = "y2";
  local_60._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_60);
  local_78._value = &this->dy1;
  local_78._name = "dy1";
  local_78._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_78);
  local_90._value = &this->dy2;
  local_90._name = "dy2";
  local_90._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_90);
  SetupCoefficients(this);
  return;
}

Assistant:

void ChFunction_Fillet3::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChFunction_Fillet3>();
    // deserialize parent class
    ChFunction::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(end);
    marchive >> CHNVP(y1);
    marchive >> CHNVP(y2);
    marchive >> CHNVP(dy1);
    marchive >> CHNVP(dy2);
    SetupCoefficients();
}